

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

Graph * Omega_h::edges_across_tris(Graph *__return_storage_ptr__,Adj *f2e,Adj *e2f)

{
  char cVar1;
  size_type *psVar2;
  int *piVar3;
  Alloc *pAVar4;
  long lVar5;
  int iVar6;
  undefined4 uVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  Alloc *pAVar11;
  void *pvVar12;
  undefined8 uVar13;
  Graph *pGVar14;
  Alloc *pAVar15;
  int iVar16;
  long *plVar17;
  undefined8 *puVar18;
  Alloc **__dest;
  long lVar19;
  ulong *puVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  Alloc *pAVar25;
  ulong uVar26;
  char cVar27;
  Alloc *pAVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  Write<int> ee2e;
  LOs e2ee;
  size_type __dnew;
  type functor;
  Read<int> e2ee_degrees;
  LOs e2ef_degrees;
  Read<signed_char> e2ef_codes;
  LOs ef2f;
  LOs e2ef;
  LOs fe2e;
  ScopedTimer local_2d1;
  Alloc *local_2d0;
  ScopedTimer local_2c1;
  ulong local_2c0;
  undefined1 local_2b8 [32];
  Alloc *local_298;
  void *local_290;
  Alloc *local_288;
  void *local_280;
  Alloc *local_278;
  void *local_270;
  Alloc *local_268;
  void *local_260;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  Alloc **local_230;
  Alloc *local_228;
  Alloc *local_220 [2];
  Alloc *local_210;
  Alloc *local_208;
  void *local_200;
  void *local_1f8;
  Write<int> local_1f0;
  Read<int> local_1e0;
  Alloc *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [56];
  LOs local_188;
  Read<int> local_178;
  LOs local_168;
  Alloc *local_158;
  void *local_150;
  undefined1 local_148 [32];
  Alloc *local_128;
  void *local_120;
  Alloc *local_118;
  void *local_110;
  Alloc *local_108;
  void *pvStack_100;
  Write<int> local_f8;
  Alloc *local_e8;
  Alloc *local_e0;
  Alloc *local_d8;
  Alloc *local_d0;
  Alloc *local_c8;
  Alloc *local_c0;
  Graph *local_b8;
  Read<signed_char> local_b0;
  Read<int> local_a0;
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  void *local_68;
  Alloc *local_60;
  void *local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_250 = &local_240;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_250);
  pAVar25 = (Alloc *)(plVar17 + 2);
  if ((Alloc *)*plVar17 == pAVar25) {
    local_148._0_8_ = pAVar25->size;
    local_148._8_8_ = plVar17[3];
    local_158 = (Alloc *)local_148;
  }
  else {
    local_148._0_8_ = pAVar25->size;
    local_158 = (Alloc *)*plVar17;
  }
  local_150 = (void *)plVar17[1];
  *plVar17 = (long)pAVar25;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  local_230 = local_220;
  std::__cxx11::string::_M_construct((ulong)&local_230,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_230,3,0x215);
  pAVar25 = (Alloc *)0xf;
  if (local_158 != (Alloc *)local_148) {
    pAVar25 = (Alloc *)local_148._0_8_;
  }
  if (pAVar25 < (Alloc *)((long)local_228 + (long)local_150)) {
    pAVar25 = (Alloc *)0xf;
    if (local_230 != local_220) {
      pAVar25 = local_220[0];
    }
    if (pAVar25 < (Alloc *)((long)local_228 + (long)local_150)) goto LAB_001d1d73;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_001d1d73:
    puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_230);
  }
  local_2b8._0_8_ = local_2b8 + 0x10;
  psVar2 = puVar18 + 2;
  if ((size_type *)*puVar18 == psVar2) {
    local_2b8._16_8_ = *psVar2;
    local_2b8._24_8_ = puVar18[3];
  }
  else {
    local_2b8._16_8_ = *psVar2;
    local_2b8._0_8_ = (size_type *)*puVar18;
  }
  local_2b8._8_8_ = puVar18[1];
  *puVar18 = psVar2;
  puVar18[1] = 0;
  *(char *)psVar2 = '\0';
  begin_code("edges_across_tris",(char *)local_2b8._0_8_);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,(ulong)((long)&local_220[0]->size + 1));
  }
  if (local_158 != (Alloc *)local_148) {
    operator_delete(local_158,(ulong)((long)(size_t *)local_148._0_8_ + 1));
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  local_40 = (f2e->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  pAVar25 = local_40;
  pvVar8 = (f2e->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_50 = (e2f->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  pAVar28 = local_50;
  pvVar9 = (e2f->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_60 = (e2f->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  pAVar15 = local_60;
  local_1f8 = (e2f->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_70 = (e2f->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_200 = (e2f->codes).write_.shared_alloc_.direct_ptr;
  if (((ulong)local_50 & 1) == 0) {
    local_2c0 = local_50->size;
  }
  else {
    local_2c0 = (ulong)local_50 >> 3;
  }
  bVar29 = local_50 != (Alloc *)0x0;
  bVar30 = ((ulong)local_50 & 7) == 0;
  local_168.write_.shared_alloc_.alloc = local_50;
  if (bVar30 && bVar29) {
    if (entering_parallel == '\x01') {
      local_168.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_2b8._0_8_ = local_2b8 + 0x10;
  local_2d0 = local_70;
  local_168.write_.shared_alloc_.direct_ptr = pvVar9;
  local_b8 = __return_storage_ptr__;
  local_68 = local_200;
  local_58 = local_1f8;
  local_48 = pvVar9;
  local_38 = pvVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
  get_degrees((Omega_h *)&local_80,&local_168,(string *)local_2b8);
  local_1c0._32_8_ = (Omega_h *)&local_80;
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  pAVar4 = local_168.write_.shared_alloc_.alloc;
  if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_168.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_168.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  local_a0.write_.shared_alloc_.alloc = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_78;
  local_1c0._24_8_ = &local_90;
  multiply_each_by<int>((Omega_h *)local_1c0._24_8_,&local_a0,2);
  pAVar4 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  local_178.write_.shared_alloc_.alloc = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.write_.shared_alloc_.alloc = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_178.write_.shared_alloc_.direct_ptr = local_88;
  local_2b8._0_8_ = local_2b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"edges to edge edges","");
  offset_scan<int>((Omega_h *)&local_1e0,&local_178,(string *)local_2b8);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  pAVar4 = local_178.write_.shared_alloc_.alloc;
  if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_178.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_178.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  local_1c0._16_8_ = &local_1e0;
  iVar16 = Read<int>::last((Read<int> *)local_1c0._16_8_);
  local_2b8._0_8_ = local_2b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"edge edges to edges","");
  Write<int>::Write(&local_1f0,iVar16,(string *)local_2b8);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  pvVar12 = local_1f0.shared_alloc_.direct_ptr;
  local_158 = pAVar28;
  if (bVar30 && bVar29) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)(pAVar28->size * 8 + 1);
    }
    else {
      pAVar28->use_count = pAVar28->use_count + 1;
    }
  }
  local_148._0_8_ = local_1e0.write_.shared_alloc_.alloc;
  if (((ulong)local_1e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148._0_8_ = (local_1e0.write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_1e0.write_.shared_alloc_.alloc)->use_count =
           (local_1e0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1c0._48_8_ = local_1e0.write_.shared_alloc_.direct_ptr;
  local_148._8_8_ = local_1e0.write_.shared_alloc_.direct_ptr;
  bVar31 = ((ulong)pAVar15 & 7) == 0;
  local_148._16_8_ = pAVar15;
  if (bVar31 && pAVar15 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148._16_8_ = (Alloc *)(pAVar15->size * 8 + 1);
    }
    else {
      pAVar15->use_count = pAVar15->use_count + 1;
    }
  }
  local_148._24_8_ = local_1f8;
  local_128 = local_2d0;
  bVar32 = local_2d0 != (Alloc *)0x0;
  bVar33 = ((ulong)local_2d0 & 7) == 0;
  if (bVar33 && bVar32) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)(local_2d0->size * 8 + 1);
    }
    else {
      local_2d0->use_count = local_2d0->use_count + 1;
    }
  }
  local_120 = local_200;
  bVar34 = ((ulong)pAVar25 & 7) == 0;
  local_118 = pAVar25;
  if (bVar34 && pAVar25 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (Alloc *)(pAVar25->size * 8 + 1);
    }
    else {
      pAVar25->use_count = pAVar25->use_count + 1;
    }
  }
  local_108 = local_1f0.shared_alloc_.alloc;
  if (((ulong)local_1f0.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)((local_1f0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f0.shared_alloc_.alloc)->use_count = (local_1f0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_100 = local_1f0.shared_alloc_.direct_ptr;
  local_230 = local_220;
  local_1d0 = (Alloc *)0x5d;
  local_210 = local_108;
  local_208 = pAVar25;
  local_1c0._40_8_ = pAVar15;
  local_150 = pvVar9;
  local_110 = pvVar8;
  local_e8 = local_128;
  local_e0 = (Alloc *)local_148._16_8_;
  local_d8 = local_158;
  local_d0 = (Alloc *)local_148._0_8_;
  local_c8 = local_118;
  local_c0 = pAVar28;
  __dest = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)&local_1d0);
  pAVar28 = local_1d0;
  local_220[0] = local_1d0;
  local_230 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_228 = pAVar28;
  *(undefined1 *)((long)__dest + (long)pAVar28) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_230);
  pAVar28 = local_208;
  local_250 = &local_240;
  puVar20 = (ulong *)(plVar17 + 2);
  if ((ulong *)*plVar17 == puVar20) {
    local_240 = *puVar20;
    lStack_238 = plVar17[3];
  }
  else {
    local_240 = *puVar20;
    local_250 = (ulong *)*plVar17;
  }
  local_248 = plVar17[1];
  *plVar17 = (long)puVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  local_1d0 = (Alloc *)local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x02');
  *(undefined2 *)&local_1d0->size = 0x3438;
  uVar26 = 0xf;
  if (local_250 != &local_240) {
    uVar26 = local_240;
  }
  if (uVar26 < (ulong)(local_1c8 + local_248)) {
    uVar26 = 0xf;
    if (local_1d0 != (Alloc *)local_1c0) {
      uVar26 = local_1c0._0_8_;
    }
    if ((ulong)(local_1c8 + local_248) <= uVar26) {
      plVar17 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_250);
      goto LAB_001d2685;
    }
  }
  plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_1d0);
LAB_001d2685:
  pAVar4 = (Alloc *)(plVar17 + 2);
  if ((Alloc *)*plVar17 == pAVar4) {
    local_2b8._16_8_ = pAVar4->size;
    local_2b8._24_8_ = plVar17[3];
    local_2b8._0_8_ = (Alloc *)(local_2b8 + 0x10);
  }
  else {
    local_2b8._16_8_ = pAVar4->size;
    local_2b8._0_8_ = (Alloc *)*plVar17;
  }
  local_2b8._8_8_ = plVar17[1];
  *plVar17 = (long)pAVar4;
  plVar17[1] = 0;
  *(undefined1 *)&pAVar4->size = 0;
  begin_code("parallel_for",(char *)local_2b8._0_8_);
  if ((Alloc *)local_2b8._0_8_ != (Alloc *)(local_2b8 + 0x10)) {
    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
  }
  if (local_1d0 != (Alloc *)local_1c0) {
    operator_delete(local_1d0,local_1c0._0_8_ + 1);
  }
  pAVar11 = local_c8;
  pAVar4 = local_210;
  local_2c0 = local_2c0 >> 2;
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,(ulong)((long)&local_220[0]->size + 1));
  }
  if (1 < (int)local_2c0) {
    local_2b8._0_8_ = local_d8;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_2b8._0_8_ = local_d8->size * 8 + 1;
    }
    local_2b8._16_8_ = local_d0;
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      local_2b8._16_8_ = local_d0->size * 8 + 1;
    }
    local_2b8._24_8_ = local_1c0._48_8_;
    local_298 = local_e0;
    if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
      local_298 = (Alloc *)(local_e0->size * 8 + 1);
    }
    local_290 = local_1f8;
    local_288 = local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_288 = (Alloc *)(local_e8->size * 8 + 1);
    }
    local_280 = local_200;
    local_278 = pAVar11;
    if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
      local_278 = (Alloc *)(pAVar11->size * 8 + 1);
    }
    local_268 = pAVar4;
    local_260 = pvVar12;
    if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
      pAVar4->use_count = pAVar4->use_count + -1;
      local_268 = (Alloc *)(pAVar4->size * 8 + 1);
    }
    uVar21 = (int)local_2c0 - 1;
    local_2c0 = (ulong)uVar21;
    local_108 = (Alloc *)0x0;
    pvStack_100 = (void *)0x0;
    entering_parallel = '\0';
    lVar19 = 0;
    do {
      iVar16 = *(int *)((long)pvVar9 + lVar19 * 4);
      iVar6 = *(int *)((long)pvVar9 + lVar19 * 4 + 4);
      uVar22 = iVar6 - iVar16;
      if (uVar22 != 0 && iVar16 <= iVar6) {
        lVar5 = (long)*(int *)((long)(size_t *)local_1c0._48_8_ + lVar19 * 4) * 4;
        uVar26 = 0;
        do {
          cVar27 = *(char *)((long)local_200 + uVar26 + (long)iVar16) >> 3;
          lVar10 = (long)*(int *)((long)local_1f8 + uVar26 * 4 + (long)iVar16 * 4) * 3;
          cVar1 = cVar27 + '\x01';
          uVar23 = cVar1 * 0x56;
          cVar27 = cVar27 + '\x02';
          uVar24 = cVar27 * 0x56;
          uVar7 = *(undefined4 *)
                   ((long)pvVar8 +
                   (long)((int)(char)(cVar27 + ((char)((uVar24 & 0xffff) >> 0xf) +
                                               (char)(uVar24 >> 8)) * -3) + (int)lVar10) * 4);
          *(undefined4 *)((long)pvVar12 + uVar26 * 8 + lVar5) =
               *(undefined4 *)
                ((long)pvVar8 +
                ((char)(cVar1 + ((char)((uVar23 & 0xffff) >> 0xf) + (char)(uVar23 >> 8)) * -3) +
                lVar10) * 4);
          *(undefined4 *)((long)pvVar12 + uVar26 * 8 + lVar5 + 4) = uVar7;
          uVar26 = uVar26 + 1;
        } while (uVar22 != uVar26);
      }
      lVar19 = lVar19 + 1;
    } while (uVar21 != (uint)lVar19);
    local_2b8._8_8_ = pvVar9;
    local_270 = pvVar8;
    edges_across_tris(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)local_2b8);
    pAVar28 = local_208;
  }
  ScopedTimer::~ScopedTimer(&local_2c1);
  pGVar14 = local_b8;
  pAVar4 = local_c0;
  local_188.write_.shared_alloc_.alloc = local_1e0.write_.shared_alloc_.alloc;
  if (((ulong)local_1e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188.write_.shared_alloc_.alloc =
           (Alloc *)((local_1e0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1e0.write_.shared_alloc_.alloc)->use_count =
           (local_1e0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_188.write_.shared_alloc_.direct_ptr = local_1e0.write_.shared_alloc_.direct_ptr;
  local_f8.shared_alloc_.alloc = local_1f0.shared_alloc_.alloc;
  if (((ulong)local_1f0.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.shared_alloc_.alloc = (Alloc *)((local_1f0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f0.shared_alloc_.alloc)->use_count = (local_1f0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.shared_alloc_.direct_ptr = local_1f0.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_b0,&local_f8);
  Adj::Adj((Adj *)local_2b8,&local_188,(LOs *)&local_b0);
  (pGVar14->a2ab).write_.shared_alloc_.alloc = (Alloc *)local_2b8._0_8_;
  (pGVar14->a2ab).write_.shared_alloc_.direct_ptr = (void *)local_2b8._8_8_;
  if (((local_2b8._0_8_ & 7) == 0 && (Alloc *)local_2b8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_2b8._0_8_ + 0x30) = *(int *)(local_2b8._0_8_ + 0x30) + -1;
    (pGVar14->a2ab).write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_2b8._0_8_ * 8 + 1);
  }
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (void *)0x0;
  (pGVar14->ab2b).write_.shared_alloc_.alloc = (Alloc *)local_2b8._16_8_;
  (pGVar14->ab2b).write_.shared_alloc_.direct_ptr = (void *)local_2b8._24_8_;
  if (((local_2b8._16_8_ & 7) == 0 && (Alloc *)local_2b8._16_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_2b8._16_8_ + 0x30) = *(int *)(local_2b8._16_8_ + 0x30) + -1;
    (pGVar14->ab2b).write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_2b8._16_8_ * 8 + 1);
  }
  local_2b8._16_8_ = 0;
  local_2b8._24_8_ = 0;
  Adj::~Adj((Adj *)local_2b8);
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(local_b0.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar11 = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar3 = &(local_f8.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_f8.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_188.write_.shared_alloc_.alloc;
  if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_188.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_188.write_.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  edges_across_tris(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)&local_158);
  if (((ulong)local_1f0.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_1f0.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_1f0.shared_alloc_.alloc);
      operator_delete(local_1f0.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_1e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_1e0.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_1e0.write_.shared_alloc_.alloc);
      operator_delete(local_1e0.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    piVar3 = &local_90->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_90);
      operator_delete(local_90,0x48);
    }
  }
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    piVar3 = &local_80->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_80);
      operator_delete(local_80,0x48);
    }
  }
  pAVar11 = local_2d0;
  if (bVar33 && bVar32) {
    piVar3 = &local_2d0->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_2d0);
      operator_delete(pAVar11,0x48);
    }
  }
  uVar13 = local_1c0._40_8_;
  if (bVar31 && pAVar15 != (Alloc *)0x0) {
    piVar3 = (int *)(local_1c0._40_8_ + 0x30);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_1c0._40_8_);
      operator_delete((void *)uVar13,0x48);
    }
  }
  if (bVar30 && bVar29) {
    piVar3 = &pAVar4->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(pAVar4);
      operator_delete(pAVar4,0x48);
    }
  }
  if (bVar34 && pAVar25 != (Alloc *)0x0) {
    piVar3 = &pAVar28->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(pAVar28);
      operator_delete(pAVar28,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_2d1);
  return pGVar14;
}

Assistant:

Graph edges_across_tris(Adj const f2e, Adj const e2f) {
  OMEGA_H_TIME_FUNCTION;
  auto const fe2e = f2e.ab2b;
  auto const e2ef = e2f.a2ab;
  auto const ef2f = e2f.ab2b;
  auto const e2ef_codes = e2f.codes;
  auto const ne = e2ef.size() - 1;
  auto const e2ef_degrees = get_degrees(e2ef);
  auto const e2ee_degrees = multiply_each_by(e2ef_degrees, 2);
  auto const e2ee = offset_scan(e2ee_degrees, "edges to edge edges");
  auto const nee = e2ee.last();
  Write<LO> ee2e(nee, "edge edges to edges");
  auto functor = OMEGA_H_LAMBDA(LO e) {
    auto const ef_begin = e2ef[e];
    auto const ef_end = e2ef[e + 1];
    auto const neef = ef_end - ef_begin;
    auto const ee_begin = e2ee[e];
    for (Int eef = 0; eef < neef; ++eef) {
      auto const ef = ef_begin + eef;
      auto const f = ef2f[ef];
      auto const e2ef_code = e2ef_codes[ef];
      auto const ffe = code_which_down(e2ef_code);
      auto const e1 = fe2e[f * 3 + ((ffe + 1) % 3)];
      auto const e2 = fe2e[f * 3 + ((ffe + 2) % 3)];
      ee2e[ee_begin + eef * 2 + 0] = e1;
      ee2e[ee_begin + eef * 2 + 1] = e2;
    }
  };
  parallel_for(ne, std::move(functor));
  return Adj(e2ee, ee2e);
}